

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

int64 Time::ticks(void)

{
  timespec ts;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  return local_18.tv_nsec / 1000000 + local_18.tv_sec * 1000;
}

Assistant:

int64 Time::ticks()
{
#ifdef _WIN32
  return GetTickCount64();
#else
  struct timespec ts;
  clock_gettime(CLOCK_MONOTONIC, &ts);
  return (int64)ts.tv_sec * 1000 + ts.tv_nsec / 1000000;
#endif
}